

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::signrawtransactionwithwallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffd9f8;
  allocator<RPCArg> *paVar2;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_ffffffffffffda00;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffda08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffda10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffda28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffda30;
  allocator<char> *in_stack_ffffffffffffda38;
  UniValue *in_stack_ffffffffffffda40;
  undefined7 in_stack_ffffffffffffda48;
  undefined1 in_stack_ffffffffffffda4f;
  string *in_stack_ffffffffffffda50;
  undefined7 in_stack_ffffffffffffda58;
  undefined1 in_stack_ffffffffffffda5f;
  undefined4 in_stack_ffffffffffffda60;
  Type in_stack_ffffffffffffda64;
  string *in_stack_ffffffffffffda68;
  undefined4 in_stack_ffffffffffffda70;
  Type in_stack_ffffffffffffda74;
  undefined4 in_stack_ffffffffffffda78;
  Type in_stack_ffffffffffffda7c;
  RPCArg *in_stack_ffffffffffffda80;
  RPCArgOptions *in_stack_ffffffffffffdaa0;
  undefined1 *local_24c8;
  RPCExamples *in_stack_ffffffffffffdb40;
  RPCResults *in_stack_ffffffffffffdb48;
  undefined1 *puVar3;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffdb50;
  string *in_stack_ffffffffffffdb58;
  string *in_stack_ffffffffffffdb60;
  RPCHelpMan *in_stack_ffffffffffffdb68;
  undefined1 *local_2480;
  undefined1 *local_2468;
  undefined1 *local_2450;
  undefined1 *local_2438;
  RPCMethodImpl *fun;
  undefined1 local_20d0 [34];
  allocator<char> local_20ae;
  allocator<char> local_20ad;
  allocator<char> local_20ac [4];
  pointer local_20a8;
  pointer pRStack_20a0;
  pointer local_2098;
  allocator<char> local_208a;
  allocator<char> local_2089 [31];
  allocator<char> local_206a;
  allocator<char> local_2069 [30];
  allocator<char> local_204b;
  allocator<char> local_204a [18];
  undefined8 local_2038;
  allocator<char> local_202a;
  allocator<char> local_2029 [31];
  allocator<char> local_200a;
  allocator<char> local_2009;
  _Alloc_hider local_2008;
  size_type sStack_2000;
  undefined1 local_1ff8 [15];
  allocator<char> local_1fe9;
  pointer local_1fe8;
  pointer pbStack_1fe0;
  pointer local_1fd8;
  allocator<char> local_1fca;
  allocator<char> local_1fc9 [31];
  allocator<char> local_1faa;
  allocator<char> local_1fa9 [31];
  allocator<char> local_1f8a;
  allocator<char> local_1f89;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  allocator<char> local_1f6a;
  allocator<char> local_1f69;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  allocator<char> local_1f4a;
  allocator<char> local_1f49 [31];
  allocator<char> local_1f2a;
  allocator<char> local_1f29 [28];
  allocator<char> local_1f0d;
  allocator<char> local_1f0c [3];
  allocator<char> local_1f09;
  undefined4 local_1f08;
  allocator<char> local_1f02;
  allocator<char> local_1f01;
  undefined4 local_1f00;
  allocator<char> local_1efa;
  allocator<char> local_1ef9;
  undefined4 local_1ef8;
  allocator<char> local_1ef2;
  allocator<char> local_1ef1;
  undefined4 local_1ef0;
  allocator<char> local_1eea;
  allocator<char> local_1ee9;
  undefined4 local_1ee8;
  allocator<char> local_1ee2;
  allocator<char> local_1ee1;
  undefined4 local_1ee0;
  allocator<char> local_1ed9 [32];
  allocator<char> local_1eb9;
  undefined4 local_1eb8;
  allocator<char> local_1eb1 [32];
  allocator<char> local_1e91;
  undefined4 local_1e90;
  allocator<char> local_1e8a;
  allocator<char> local_1e89;
  undefined4 local_1e88;
  allocator<char> local_1e81 [32];
  allocator<char> local_1e61 [513];
  undefined1 local_1c60 [136];
  undefined1 local_1bd8 [192];
  undefined1 local_1b18 [408];
  RPCMethodImpl local_1980 [12];
  undefined1 local_17e8 [64];
  undefined1 local_17a8 [136];
  undefined1 local_1720 [192];
  undefined1 local_1660 [408];
  undefined1 local_14c8 [200];
  undefined1 local_1400;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined1 local_13c0;
  undefined1 local_13bf;
  allocator<RPCArg> local_12c0 [40];
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined1 local_1280;
  undefined1 local_127f;
  allocator<RPCArg> local_1278 [40];
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined1 local_1238;
  undefined1 local_1237;
  undefined1 local_1230;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined1 local_11f0;
  undefined1 local_11ef;
  undefined1 local_1148;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined1 local_1108;
  undefined1 local_1107;
  undefined1 local_1060;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined1 local_1020;
  undefined1 local_101f;
  undefined8 local_1000;
  undefined1 local_f78;
  undefined8 local_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined1 local_f38;
  undefined1 local_f37;
  undefined1 local_e90;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined1 local_e50;
  undefined1 local_e4f;
  undefined1 local_da8;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d70;
  undefined1 local_d68;
  undefined1 local_d67;
  undefined1 local_cc0 [1584];
  undefined1 local_690 [160];
  undefined1 local_5f0 [264];
  undefined1 local_4e8 [160];
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  sStack_2000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffda40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1e88 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1e90 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1eb8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1ee0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_da8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_d80 = 0;
  uStack_d78 = 0;
  local_d70 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_d68 = 0;
  local_d67 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1ee8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_e90 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_e68 = 0;
  uStack_e60 = 0;
  local_e58 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_e50 = 0;
  local_e4f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1ef0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_f78 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_f50 = 0;
  uStack_f48 = 0;
  local_f40 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_f38 = 0;
  local_f37 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1ef8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1060 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_1038 = 0;
  uStack_1030 = 0;
  local_1028 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_1020 = 0;
  local_101f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1f00 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1148 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_1120 = 0;
  uStack_1118 = 0;
  local_1110 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_1108 = 0;
  local_1107 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1f08 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,&in_stack_ffffffffffffda00->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1230 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_1208 = 0;
  uStack_1200 = 0;
  local_11f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_11f0 = 0;
  local_11ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffd9f8);
  __l._M_len._0_7_ = in_stack_ffffffffffffda48;
  __l._M_array = (iterator)in_stack_ffffffffffffda40;
  __l._M_len._7_1_ = in_stack_ffffffffffffda4f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffda38,__l,
             (allocator_type *)in_stack_ffffffffffffda30);
  local_1278[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_1250 = 0;
  uStack_1248 = 0;
  local_1240 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd9f8);
  local_1238 = 0;
  local_1237 = 0;
  paVar2 = local_1278;
  RPCArg::RPCArg(in_stack_ffffffffffffda80,
                 (string *)CONCAT44(in_stack_ffffffffffffda7c,in_stack_ffffffffffffda78),
                 in_stack_ffffffffffffda74,(Fallback *)in_stack_ffffffffffffda68,
                 (string *)CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffdaa0);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffda48;
  __l_00._M_array = (iterator)in_stack_ffffffffffffda40;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffda4f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffda38,__l_00,
             (allocator_type *)in_stack_ffffffffffffda30);
  local_12c0[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_1298 = 0;
  uStack_1290 = 0;
  local_1288 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1280 = 0;
  local_127f = 0;
  paVar2 = local_12c0;
  RPCArg::RPCArg(in_stack_ffffffffffffda80,
                 (string *)CONCAT44(in_stack_ffffffffffffda7c,in_stack_ffffffffffffda78),
                 in_stack_ffffffffffffda74,(Fallback *)in_stack_ffffffffffffda68,
                 (string *)CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffdaa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  UniValue::UniValue<const_char_(&)[35],_char[35],_true>
            (in_stack_ffffffffffffda40,(char (*) [35])in_stack_ffffffffffffda38);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffda08,in_stack_ffffffffffffda00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1400 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffda10);
  local_13d8 = 0;
  uStack_13d0 = 0;
  local_13c8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_13c0 = 0;
  local_13bf = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
                 in_stack_ffffffffffffda68,in_stack_ffffffffffffda64,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
                 in_stack_ffffffffffffda50,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffda48;
  __l_01._M_array = (iterator)in_stack_ffffffffffffda40;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffda4f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffda38,__l_01,
             (allocator_type *)in_stack_ffffffffffffda30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1f68 = 0;
  uStack_1f60 = 0;
  local_1f58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1f88 = 0;
  uStack_1f80 = 0;
  local_1f78 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_1fe8 = (pointer)0x0;
  pbStack_1fe0 = (pointer)0x0;
  local_1fd8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_2008._M_p = (pointer)0x0;
  sStack_2000 = 0;
  local_1ff8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_204a[2] = (allocator<char>)0x0;
  local_204a[3] = (allocator<char>)0x0;
  local_204a[4] = (allocator<char>)0x0;
  local_204a[5] = (allocator<char>)0x0;
  local_204a[6] = (allocator<char>)0x0;
  local_204a[7] = (allocator<char>)0x0;
  local_204a[8] = (allocator<char>)0x0;
  local_204a[9] = (allocator<char>)0x0;
  local_204a[10] = (allocator<char>)0x0;
  local_204a[0xb] = (allocator<char>)0x0;
  local_204a[0xc] = (allocator<char>)0x0;
  local_204a[0xd] = (allocator<char>)0x0;
  local_204a[0xe] = (allocator<char>)0x0;
  local_204a[0xf] = (allocator<char>)0x0;
  local_204a[0x10] = (allocator<char>)0x0;
  local_204a[0x11] = (allocator<char>)0x0;
  local_2038._0_1_ = '\0';
  local_2038._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffda48;
  __l_02._M_array = (iterator)in_stack_ffffffffffffda40;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffda4f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda38,__l_02,
             (allocator_type *)in_stack_ffffffffffffda30);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  fun = local_1980;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_2069[1] = (allocator<char>)0x0;
  local_2069[2] = (allocator<char>)0x0;
  local_2069[3] = (allocator<char>)0x0;
  local_2069[4] = (allocator<char>)0x0;
  local_2069[5] = (allocator<char>)0x0;
  local_2069[6] = (allocator<char>)0x0;
  local_2069[7] = (allocator<char>)0x0;
  local_2069[8] = (allocator<char>)0x0;
  local_2069[9] = (allocator<char>)0x0;
  local_2069[10] = (allocator<char>)0x0;
  local_2069[0xb] = (allocator<char>)0x0;
  local_2069[0xc] = (allocator<char>)0x0;
  local_2069[0xd] = (allocator<char>)0x0;
  local_2069[0xe] = (allocator<char>)0x0;
  local_2069[0xf] = (allocator<char>)0x0;
  local_2069[0x10] = (allocator<char>)0x0;
  local_2069[0x11] = (allocator<char>)0x0;
  local_2069[0x12] = (allocator<char>)0x0;
  local_2069[0x13] = (allocator<char>)0x0;
  local_2069[0x14] = (allocator<char>)0x0;
  local_2069[0x15] = (allocator<char>)0x0;
  local_2069[0x16] = (allocator<char>)0x0;
  local_2069[0x17] = (allocator<char>)0x0;
  local_2069[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_2089[1] = (allocator<char>)0x0;
  local_2089[2] = (allocator<char>)0x0;
  local_2089[3] = (allocator<char>)0x0;
  local_2089[4] = (allocator<char>)0x0;
  local_2089[5] = (allocator<char>)0x0;
  local_2089[6] = (allocator<char>)0x0;
  local_2089[7] = (allocator<char>)0x0;
  local_2089[8] = (allocator<char>)0x0;
  local_2089[9] = (allocator<char>)0x0;
  local_2089[10] = (allocator<char>)0x0;
  local_2089[0xb] = (allocator<char>)0x0;
  local_2089[0xc] = (allocator<char>)0x0;
  local_2089[0xd] = (allocator<char>)0x0;
  local_2089[0xe] = (allocator<char>)0x0;
  local_2089[0xf] = (allocator<char>)0x0;
  local_2089[0x10] = (allocator<char>)0x0;
  local_2089[0x11] = (allocator<char>)0x0;
  local_2089[0x12] = (allocator<char>)0x0;
  local_2089[0x13] = (allocator<char>)0x0;
  local_2089[0x14] = (allocator<char>)0x0;
  local_2089[0x15] = (allocator<char>)0x0;
  local_2089[0x16] = (allocator<char>)0x0;
  local_2089[0x17] = (allocator<char>)0x0;
  local_2089[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  local_20a8 = (pointer)0x0;
  pRStack_20a0 = (pointer)0x0;
  local_2098 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffda48;
  __l_03._M_array = (iterator)in_stack_ffffffffffffda40;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffda4f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda38,__l_03,
             (allocator_type *)in_stack_ffffffffffffda30);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffda48;
  __l_04._M_array = (iterator)in_stack_ffffffffffffda40;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffda4f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda38,__l_04,
             (allocator_type *)in_stack_ffffffffffffda30);
  this = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffda7c,in_stack_ffffffffffffda78),
             in_stack_ffffffffffffda74,in_stack_ffffffffffffda68,
             SUB41(in_stack_ffffffffffffda64 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffda5f,in_stack_ffffffffffffda58),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda50,
             (bool)in_stack_ffffffffffffda4f);
  std::allocator<RPCResult>::allocator(this);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffda48;
  __l_05._M_array = (iterator)in_stack_ffffffffffffda40;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffda4f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda38,__l_05,
             (allocator_type *)in_stack_ffffffffffffda30);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (string *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (bool)in_stack_ffffffffffffda5f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffda7c,in_stack_ffffffffffffda78),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffda74,in_stack_ffffffffffffda70));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  HelpExampleCli(in_stack_ffffffffffffda30,in_stack_ffffffffffffda28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffda4f,in_stack_ffffffffffffda48),
             (char *)in_stack_ffffffffffffda40,in_stack_ffffffffffffda38);
  HelpExampleRpc(in_stack_ffffffffffffda30,in_stack_ffffffffffffda28);
  std::operator+(in_stack_ffffffffffffda30,in_stack_ffffffffffffda28);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x5707d4);
  this_00 = (RPCArg *)local_20d0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::signrawtransactionwithwallet()::__0,void>
            (in_stack_ffffffffffffda08,(anon_class_1_0_00000001 *)in_stack_ffffffffffffda00);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60,in_stack_ffffffffffffdb58,
             in_stack_ffffffffffffdb50,in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_20d0 + 0x21));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_20ae);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_20ad);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_20ac);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_2438 = local_14c8;
  do {
    local_2438 = local_2438 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_2438 != local_1660);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_2450 = local_1720;
  do {
    local_2450 = local_2450 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_2450 != local_17a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_2468 = local_17e8;
  do {
    local_2468 = local_2468 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_2468 != local_1b18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_208a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2089);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_206a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2069);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_204b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_204a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_2480 = local_1bd8;
  do {
    local_2480 = local_2480 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_2480 != local_1c60);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_202a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_2029);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_200a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_2009);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1ff8 + 0xe));
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1fe9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1fca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1fc9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1faa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1fa9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f8a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f6a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffda08);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f4a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1f49);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f2a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1f29);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffda08);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar3 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f0d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1f0c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffda08);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar3 = local_5f0;
  puVar1 = local_4e8;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffda08);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_24c8 = local_690;
  do {
    local_24c8 = local_24c8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_24c8 != local_cc0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f09);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f02);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1f01);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1efa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1ef9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1ef2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1ef1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1eea);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1ee9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1ee2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1ee1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1ed9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1eb9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1eb1);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1e91);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1e8a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_1e89);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1e81);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_1e61);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan signrawtransactionwithwallet()
{
    return RPCHelpMan{"signrawtransactionwithwallet",
                "\nSign inputs for raw transaction (serialized, hex-encoded).\n"
                "The second optional argument (may be null) is an array of previous transaction outputs that\n"
                "this transaction depends on but may not yet be in the block chain." +
        HELP_REQUIRING_PASSPHRASE,
                {
                    {"hexstring", RPCArg::Type::STR, RPCArg::Optional::NO, "The transaction hex string"},
                    {"prevtxs", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "The previous dependent transaction outputs",
                        {
                            {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                {
                                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                                    {"vout", RPCArg::Type::NUM, RPCArg::Optional::NO, "The output number"},
                                    {"scriptPubKey", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The output script"},
                                    {"redeemScript", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "(required for P2SH) redeem script"},
                                    {"witnessScript", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "(required for P2WSH or P2SH-P2WSH) witness script"},
                                    {"amount", RPCArg::Type::AMOUNT, RPCArg::Optional::OMITTED, "(required for Segwit inputs) the amount spent"},
                                },
                            },
                        },
                    },
                    {"sighashtype", RPCArg::Type::STR, RPCArg::Default{"DEFAULT for Taproot, ALL otherwise"}, "The signature hash type. Must be one of\n"
            "       \"DEFAULT\"\n"
            "       \"ALL\"\n"
            "       \"NONE\"\n"
            "       \"SINGLE\"\n"
            "       \"ALL|ANYONECANPAY\"\n"
            "       \"NONE|ANYONECANPAY\"\n"
            "       \"SINGLE|ANYONECANPAY\""},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "hex", "The hex-encoded raw transaction with signature(s)"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                        {RPCResult::Type::ARR, "errors", /*optional=*/true, "Script verification errors (if there are any)",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR_HEX, "txid", "The hash of the referenced, previous transaction"},
                                {RPCResult::Type::NUM, "vout", "The index of the output to spent and used as input"},
                                {RPCResult::Type::ARR, "witness", "",
                                {
                                    {RPCResult::Type::STR_HEX, "witness", ""},
                                }},
                                {RPCResult::Type::STR_HEX, "scriptSig", "The hex-encoded signature script"},
                                {RPCResult::Type::NUM, "sequence", "Script sequence number"},
                                {RPCResult::Type::STR, "error", "Verification or signing error related to the input"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("signrawtransactionwithwallet", "\"myhex\"")
            + HelpExampleRpc("signrawtransactionwithwallet", "\"myhex\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    CMutableTransaction mtx;
    if (!DecodeHexTx(mtx, request.params[0].get_str())) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "TX decode failed. Make sure the tx has at least one input.");
    }

    // Sign the transaction
    LOCK(pwallet->cs_wallet);
    EnsureWalletIsUnlocked(*pwallet);

    // Fetch previous transactions (inputs):
    std::map<COutPoint, Coin> coins;
    for (const CTxIn& txin : mtx.vin) {
        coins[txin.prevout]; // Create empty map entry keyed by prevout.
    }
    pwallet->chain().findCoins(coins);

    // Parse the prevtxs array
    ParsePrevouts(request.params[1], nullptr, coins);

    int nHashType = ParseSighashString(request.params[2]);

    // Script verification errors
    std::map<int, bilingual_str> input_errors;

    bool complete = pwallet->SignTransaction(mtx, coins, nHashType, input_errors);
    UniValue result(UniValue::VOBJ);
    SignTransactionResultToJSON(mtx, complete, coins, input_errors, result);
    return result;
},
    };
}